

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmj02tables.h
# Opt level: O2

Point2f pbrt::GetPMJ02BNSample(int setIndex,int sampleIndex)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(pmj02bnSamples +
                           (long)(sampleIndex % 0x10000) * 8 + (long)(setIndex % 5) * 0x80000);
  auVar2 = vcvtudq2pd_avx512vl(auVar2);
  auVar1._8_8_ = 0x3df0000000000000;
  auVar1._0_8_ = 0x3df0000000000000;
  auVar2 = vmulpd_avx512vl(auVar2,auVar1);
  auVar2 = vcvtpd2ps_avx(auVar2);
  return (Point2f)auVar2._0_8_;
}

Assistant:

PBRT_CPU_GPU
inline Point2f GetPMJ02BNSample(int setIndex, int sampleIndex) {
    setIndex %= nPMJ02bnSets;
    DCHECK_LT(sampleIndex, nPMJ02bnSamples);
    sampleIndex %= nPMJ02bnSamples;

    // Convert from fixed-point.
#ifdef PBRT_IS_GPU_CODE
    return Point2f(pmj02bnSamples[setIndex][sampleIndex][0] * 0x1p-32f,
                   pmj02bnSamples[setIndex][sampleIndex][1] * 0x1p-32f);
#else
    // Double precision is key here for the pixel sample sorting, but not
    // necessary otherwise.
    return Point2f(pmj02bnSamples[setIndex][sampleIndex][0] * 0x1p-32,
                   pmj02bnSamples[setIndex][sampleIndex][1] * 0x1p-32);
#endif
}